

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,ArrayElementRef *s)

{
  replaceExpression(this,&s->object);
  if ((s->startIndex).object != (Expression *)0x0) {
    replaceExpression(this,&s->startIndex);
  }
  if ((s->endIndex).object != (Expression *)0x0) {
    replaceExpression(this,&s->endIndex);
  }
  return &s->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::ArrayElementRef& s)
    {
        replaceExpression (s.object);
        if (s.startIndex != nullptr)  replaceExpression (s.startIndex);
        if (s.endIndex != nullptr)    replaceExpression (s.endIndex);
        return s;
    }